

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# iothub_registrymanager.c
# Opt level: O3

IOTHUB_REGISTRYMANAGER_RESULT
IoTHubRegistryManager_GetModule
          (IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle,char *deviceId,char *moduleId,
          IOTHUB_MODULE *module)

{
  undefined4 in_EAX;
  int iVar1;
  IOTHUB_REGISTRYMANAGER_RESULT IVar2;
  LOGGER_LOG p_Var3;
  char *pcVar4;
  undefined1 auVar5 [16];
  IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;
  IOTHUB_DEVICE_OR_MODULE IStack_b8;
  
  auVar5._0_4_ = -(uint)(registryManagerHandle == (IOTHUB_REGISTRYMANAGER_HANDLE)0x0);
  auVar5._4_4_ = -(uint)(deviceId == (char *)0x0);
  auVar5._8_4_ = -(uint)(moduleId == (char *)0x0);
  auVar5._12_4_ = -(uint)(module == (IOTHUB_MODULE *)0x0);
  iVar1 = movmskps(in_EAX,auVar5);
  if (iVar1 == 0) {
    if (module->version == 1) {
      IVar2 = IoTHubRegistryManager_GetDeviceOrModule
                        (registryManagerHandle,deviceId,moduleId,&IStack_b8);
      if (IStack_b8.moduleId == (char *)0x0) {
        return IOTHUB_REGISTRYMANAGER_DEVICE_NOT_EXIST;
      }
      if (IVar2 != IOTHUB_REGISTRYMANAGER_OK) {
        return IVar2;
      }
      move_deviceOrModule_members_to_module(&IStack_b8,module);
      return IOTHUB_REGISTRYMANAGER_OK;
    }
    p_Var3 = xlogging_get_log_function();
    IVar2 = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    pcVar4 = "module must have a valid version";
    iVar1 = 0x7a8;
  }
  else {
    p_Var3 = xlogging_get_log_function();
    if (p_Var3 == (LOGGER_LOG)0x0) {
      return IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    pcVar4 = "Input parameter cannot be NULL";
    IVar2 = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    iVar1 = 0x7a3;
  }
  (*p_Var3)(AZ_LOG_ERROR,
            "/workspace/llm4binary/github/license_all_cmakelists_25/Azure[P]azure-iot-c-back-compat/deps/azure-iot-sdk-c/iothub_service_client/src/iothub_registrymanager.c"
            ,"IoTHubRegistryManager_GetModule",iVar1,1,pcVar4);
  return IVar2;
}

Assistant:

IOTHUB_REGISTRYMANAGER_RESULT IoTHubRegistryManager_GetModule(IOTHUB_REGISTRYMANAGER_HANDLE registryManagerHandle, const char* deviceId, const char* moduleId, IOTHUB_MODULE* module)
{
    IOTHUB_REGISTRYMANAGER_RESULT result;

    if ((registryManagerHandle == NULL) || (deviceId == NULL) || (moduleId == NULL) || (module == NULL))
    {
        LogError("Input parameter cannot be NULL");
        result = IOTHUB_REGISTRYMANAGER_INVALID_ARG;
    }
    else if (module->version < IOTHUB_MODULE_VERSION_1 || module->version > IOTHUB_MODULE_VERSION_LATEST)
    {
        LogError("module must have a valid version");
        result = IOTHUB_REGISTRYMANAGER_INVALID_VERSION;
    }
    else
    {
        IOTHUB_DEVICE_OR_MODULE deviceOrModuleInfo;

        result = IoTHubRegistryManager_GetDeviceOrModule(registryManagerHandle, deviceId, moduleId, &deviceOrModuleInfo);
        if (deviceOrModuleInfo.moduleId == NULL)
        {
            result = IOTHUB_REGISTRYMANAGER_DEVICE_NOT_EXIST;
        }
        else if (result == IOTHUB_REGISTRYMANAGER_OK)
        {
            move_deviceOrModule_members_to_module(&deviceOrModuleInfo, module);
        }
    }

    return result;
}